

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftp.c
# Opt level: O1

_Bool sftp_get_file(char *fname,char *outfname,_Bool recurse,_Bool restart)

{
  StripCtrlChars *pSVar1;
  void *pvVar2;
  _Bool _Var3;
  bool bVar4;
  int iVar5;
  int iVar6;
  sftp_request *psVar7;
  sftp_packet *psVar8;
  fxp_handle *pfVar9;
  WFile *f;
  uint64_t offset;
  size_t sVar10;
  char *pcVar11;
  char *pcVar12;
  fxp_xfer *xfer;
  fxp_names *names;
  fxp_name *pfVar13;
  undefined7 in_register_00000011;
  byte bVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  ptrlen str;
  ptrlen str_00;
  ptrlen str_01;
  ptrlen str_02;
  ptrlen str_03;
  ptrlen str_04;
  ptrlen str_05;
  ptrlen str_06;
  ptrlen str_07;
  wchar_t len;
  size_t namesize;
  fxp_attrs attrs;
  void *local_a0;
  int local_84;
  char *local_80;
  void *local_78;
  char *local_70;
  fxp_attrs local_68;
  
  if ((int)CONCAT71(in_register_00000011,recurse) != 0) {
    psVar7 = fxp_stat_send(fname);
    psVar8 = sftp_wait_for_reply(psVar7);
    _Var3 = fxp_stat_recv(psVar8,psVar7,&local_68);
    bVar4 = true;
    if (((_Var3) && ((local_68.flags & 4) != 0)) && ((local_68.permissions._1_1_ & 0x40) != 0)) {
      iVar5 = file_type(outfname);
      if ((iVar5 == 2) || (_Var3 = create_directory(outfname), pSVar1 = string_scc, _Var3)) {
        psVar7 = fxp_opendir_send(fname);
        psVar8 = sftp_wait_for_reply(psVar7);
        pfVar9 = fxp_opendir_recv(psVar8,psVar7);
        pSVar1 = string_scc;
        if (pfVar9 != (fxp_handle *)0x0) {
          local_78 = (void *)0x0;
          local_a0 = (void *)0x0;
          uVar20 = 0;
          local_80 = fname;
          local_70 = outfname;
          do {
            psVar7 = fxp_readdir_send(pfVar9);
            psVar8 = sftp_wait_for_reply(psVar7);
            names = fxp_readdir_recv(psVar8,psVar7);
            if (names == (fxp_names *)0x0) {
              iVar5 = fxp_error_type();
              pcVar11 = local_80;
              pSVar1 = string_scc;
              if (iVar5 == 1) goto LAB_0010fa22;
              sVar10 = strlen(local_80);
              str_04.len = sVar10;
              str_04.ptr = pcVar11;
              pcVar11 = stripctrl_string_ptrlen(pSVar1,str_04);
              if (pcVar11 != (char *)0x0) {
                pcVar12 = fxp_error();
                printf("%s: reading directory: %s\n",pcVar11,pcVar12);
                safefree(pcVar11);
              }
              psVar7 = fxp_close_send(pfVar9);
              psVar8 = sftp_wait_for_reply(psVar7);
              fxp_close_recv(psVar8,psVar7);
              safefree(local_a0);
              iVar5 = 1;
              bVar4 = false;
            }
            else if ((long)names->nnames == 0) {
              fxp_free_names(names);
LAB_0010fa22:
              iVar5 = 9;
              bVar4 = false;
            }
            else {
              local_a0 = safegrowarray(local_a0,(size_t *)&local_78,8,uVar20,(long)names->nnames,
                                       false);
              if (0 < names->nnames) {
                lVar18 = 0;
                lVar16 = 0;
                do {
                  pcVar11 = *(char **)((long)&names->names->filename + lVar18);
                  iVar5 = strcmp(pcVar11,".");
                  if ((iVar5 != 0) && (iVar5 = strcmp(pcVar11,".."), iVar5 != 0)) {
                    _Var3 = vet_filename(pcVar11);
                    pSVar1 = string_scc;
                    if (_Var3) {
                      pfVar13 = fxp_dup_name((fxp_name *)((long)&names->names->filename + lVar18));
                      *(fxp_name **)((long)local_a0 + uVar20 * 8) = pfVar13;
                      uVar20 = uVar20 + 1;
                    }
                    else {
                      pcVar11 = *(char **)((long)&names->names->filename + lVar18);
                      sVar10 = strlen(pcVar11);
                      str_03.len = sVar10;
                      str_03.ptr = pcVar11;
                      pcVar11 = stripctrl_string_ptrlen(pSVar1,str_03);
                      if (pcVar11 != (char *)0x0) {
                        printf("ignoring potentially dangerous server-supplied filename \'%s\'\n",
                               pcVar11);
                        safefree(pcVar11);
                      }
                    }
                  }
                  lVar16 = lVar16 + 1;
                  lVar18 = lVar18 + 0x48;
                } while (lVar16 < names->nnames);
              }
              fxp_free_names(names);
              iVar5 = 0;
              bVar4 = true;
              outfname = local_70;
            }
          } while (iVar5 == 0);
          if (iVar5 == 9) {
            psVar7 = fxp_close_send(pfVar9);
            psVar8 = sftp_wait_for_reply(psVar7);
            fxp_close_recv(psVar8,psVar7);
            if (uVar20 != 0) {
              qsort(local_a0,uVar20,8,sftp_name_compare);
            }
            iVar5 = 0;
            if (restart) {
              uVar17 = 0;
              iVar5 = 1;
              do {
                iVar15 = iVar5;
                iVar5 = (int)uVar20;
                if (uVar20 == uVar17) goto LAB_0010fbe4;
                pcVar11 = dir_file_cat(outfname,(char *)**(undefined8 **)
                                                          ((long)local_a0 + uVar17 * 8));
                iVar6 = file_type(pcVar11);
                safefree(pcVar11);
                uVar17 = uVar17 + 1;
                iVar5 = iVar15 + -1;
              } while (iVar6 != 0);
              iVar5 = -(iVar15 + -1);
LAB_0010fbe4:
              iVar5 = iVar5 - (uint)(0 < iVar5);
            }
            for (; uVar17 = (ulong)iVar5, uVar17 < uVar20; iVar5 = iVar5 + 1) {
              pcVar11 = dupcat_fn(local_80,"/",**(undefined8 **)((long)local_a0 + uVar17 * 8),0);
              pcVar12 = dir_file_cat(outfname,(char *)**(undefined8 **)((long)local_a0 + uVar17 * 8)
                                    );
              _Var3 = sftp_get_file(pcVar11,pcVar12,true,(_Bool)(restart & 1));
              safefree(pcVar12);
              safefree(pcVar11);
              if (!_Var3) {
                uVar17 = 0;
                do {
                  fxp_free_name(*(fxp_name **)((long)local_a0 + uVar17 * 8));
                  uVar17 = uVar17 + 1;
                } while (uVar20 != uVar17);
                safefree(local_a0);
                iVar5 = (int)uVar20;
              }
              outfname = local_70;
              if (!_Var3) {
                bVar4 = false;
                restart = false;
                psVar7 = (sftp_request *)0x0;
                fname = local_80;
                goto LAB_0010f4b1;
              }
              restart = false;
            }
            if (uVar20 != 0) {
              uVar17 = 0;
              do {
                fxp_free_name(*(fxp_name **)((long)local_a0 + uVar17 * 8));
                uVar17 = uVar17 + 1;
              } while (uVar20 != uVar17);
            }
            safefree(local_a0);
            psVar7 = (sftp_request *)0x1;
            bVar4 = false;
            fname = local_80;
          }
          else {
            psVar7 = (sftp_request *)0x0;
            fname = local_80;
          }
          goto LAB_0010f4b1;
        }
        sVar10 = strlen(fname);
        str_06.len = sVar10;
        str_06.ptr = fname;
        pcVar11 = stripctrl_string_ptrlen(pSVar1,str_06);
        if (pcVar11 != (char *)0x0) {
          pcVar12 = fxp_error();
          printf("%s: unable to open directory: %s\n",pcVar11,pcVar12);
          goto LAB_0010fbc7;
        }
      }
      else {
        sVar10 = strlen(outfname);
        str_07.len = sVar10;
        str_07.ptr = outfname;
        pcVar11 = stripctrl_string_ptrlen(pSVar1,str_07);
        if (pcVar11 != (char *)0x0) {
          printf("%s: Cannot create directory\n",pcVar11);
LAB_0010fbc7:
          safefree(pcVar11);
        }
      }
      bVar4 = false;
      psVar7 = (sftp_request *)0x0;
    }
LAB_0010f4b1:
    bVar14 = (byte)psVar7;
    if (!bVar4) goto LAB_0010fb39;
  }
  psVar7 = fxp_stat_send(fname);
  psVar8 = sftp_wait_for_reply(psVar7);
  _Var3 = fxp_stat_recv(psVar8,psVar7,&local_68);
  if (!_Var3) {
    local_68.flags = 0;
  }
  psVar7 = fxp_open_send(fname,1,(fxp_attrs *)0x0);
  psVar8 = sftp_wait_for_reply(psVar7);
  pfVar9 = fxp_open_recv(psVar8,psVar7);
  pSVar1 = string_scc;
  if (pfVar9 == (fxp_handle *)0x0) {
    sVar10 = strlen(fname);
    str.len = sVar10;
    str.ptr = fname;
    pcVar11 = stripctrl_string_ptrlen(pSVar1,str);
    if (pcVar11 != (char *)0x0) {
      pcVar12 = fxp_error();
      bVar14 = 0;
      printf("%s: open for read: %s\n",pcVar11,pcVar12);
      safefree(pcVar11);
      goto LAB_0010fb39;
    }
  }
  else {
    if (restart == false) {
      f = open_new_file(outfname,-(ulong)((local_68.flags & 4) == 0) |
                                 CONCAT62(local_68.permissions._2_6_,
                                          CONCAT11(local_68.permissions._1_1_,
                                                   (undefined1)local_68.permissions)));
    }
    else {
      f = open_existing_wfile(outfname,(uint64_t *)0x0);
    }
    pSVar1 = string_scc;
    if (f != (WFile *)0x0) {
      if (restart == false) {
        offset = 0;
      }
      else {
        iVar5 = seek_file(f,0,2);
        if (iVar5 == -1) {
          close_wfile(f);
          pSVar1 = string_scc;
          sVar10 = strlen(outfname);
          str_05.len = sVar10;
          str_05.ptr = outfname;
          pcVar11 = stripctrl_string_ptrlen(pSVar1,str_05);
          if (pcVar11 != (char *)0x0) {
            pcVar12 = "reget: cannot restart %s - file too large\n";
            goto LAB_0010fb07;
          }
          goto LAB_0010fb19;
        }
        offset = get_file_posn(f);
        printf("reget: restarting at file position %lu\n",offset);
      }
      pSVar1 = string_scc;
      sVar10 = strlen(fname);
      str_01.len = sVar10;
      str_01.ptr = fname;
      pcVar11 = stripctrl_string_ptrlen(pSVar1,str_01);
      pSVar1 = string_scc;
      if (pcVar11 != (char *)0x0) {
        sVar10 = strlen(outfname);
        str_02.len = sVar10;
        str_02.ptr = outfname;
        pcVar12 = stripctrl_string_ptrlen(pSVar1,str_02);
        if (pcVar12 != (char *)0x0) {
          printf("remote:%s => local:%s\n",pcVar11,pcVar12);
          safefree(pcVar12);
        }
        safefree(pcVar11);
      }
      xfer = xfer_download_init(pfVar9,offset);
      _Var3 = xfer_done(xfer);
      bVar14 = 1;
      if (!_Var3) {
        bVar14 = 1;
        bVar4 = false;
        do {
          xfer_download_queue(xfer);
          psVar8 = sftp_recv();
          iVar5 = xfer_download_gotpkt(xfer,psVar8);
          if (iVar5 < 1) {
            if (!bVar4) {
              pcVar11 = fxp_error();
              printf("error while reading: %s\n",pcVar11);
              bVar4 = true;
            }
            bVar14 = 0;
          }
          while (_Var3 = xfer_download_data(xfer,&local_78,&local_84), pvVar2 = local_78, _Var3) {
            if (local_84 < 1) {
              uVar20 = 0;
            }
            else {
              uVar20 = 0;
              do {
                iVar5 = write_to_file(f,(void *)(uVar20 + (long)pvVar2),local_84 - (int)uVar20);
                if (iVar5 < 1) {
                  puts("error while writing local file");
                  xfer_set_error(xfer);
                  bVar14 = 0;
                  break;
                }
                uVar19 = (int)uVar20 + iVar5;
                uVar20 = (ulong)uVar19;
              } while ((int)uVar19 < local_84);
            }
            if ((int)uVar20 < local_84) {
              xfer_set_error(xfer);
              bVar14 = 0;
            }
            safefree(local_78);
          }
          _Var3 = xfer_done(xfer);
        } while (!_Var3);
      }
      xfer_cleanup(xfer);
      close_wfile(f);
      psVar7 = fxp_close_send(pfVar9);
      psVar8 = sftp_wait_for_reply(psVar7);
      fxp_close_recv(psVar8,psVar7);
      goto LAB_0010fb39;
    }
    sVar10 = strlen(outfname);
    str_00.len = sVar10;
    str_00.ptr = outfname;
    pcVar11 = stripctrl_string_ptrlen(pSVar1,str_00);
    if (pcVar11 != (char *)0x0) {
      pcVar12 = "local: unable to open %s\n";
LAB_0010fb07:
      printf(pcVar12,pcVar11);
      safefree(pcVar11);
    }
LAB_0010fb19:
    psVar7 = fxp_close_send(pfVar9);
    psVar8 = sftp_wait_for_reply(psVar7);
    fxp_close_recv(psVar8,psVar7);
  }
  bVar14 = 0;
LAB_0010fb39:
  return (_Bool)(bVar14 & 1);
}

Assistant:

bool sftp_get_file(char *fname, char *outfname, bool recurse, bool restart)
{
    struct fxp_handle *fh;
    struct sftp_packet *pktin;
    struct sftp_request *req;
    struct fxp_xfer *xfer;
    uint64_t offset;
    WFile *file;
    bool toret, shown_err = false;
    struct fxp_attrs attrs;

    /*
     * In recursive mode, see if we're dealing with a directory.
     * (If we're not in recursive mode, we need not even check: the
     * subsequent FXP_OPEN will return a usable error message.)
     */
    if (recurse) {
        bool result;

        req = fxp_stat_send(fname);
        pktin = sftp_wait_for_reply(req);
        result = fxp_stat_recv(pktin, req, &attrs);

        if (result &&
            (attrs.flags & SSH_FILEXFER_ATTR_PERMISSIONS) &&
            (attrs.permissions & 0040000)) {

            struct fxp_handle *dirhandle;
            size_t nnames, namesize;
            struct fxp_name **ournames;
            struct fxp_names *names;
            int i;

            /*
             * First, attempt to create the destination directory,
             * unless it already exists.
             */
            if (file_type(outfname) != FILE_TYPE_DIRECTORY &&
                !create_directory(outfname)) {
                with_stripctrl(san, outfname)
                    printf("%s: Cannot create directory\n", san);
                return false;
            }

            /*
             * Now get the list of filenames in the remote
             * directory.
             */
            req = fxp_opendir_send(fname);
            pktin = sftp_wait_for_reply(req);
            dirhandle = fxp_opendir_recv(pktin, req);

            if (!dirhandle) {
                with_stripctrl(san, fname)
                    printf("%s: unable to open directory: %s\n",
                           san, fxp_error());
                return false;
            }
            nnames = namesize = 0;
            ournames = NULL;
            while (1) {
                int i;

                req = fxp_readdir_send(dirhandle);
                pktin = sftp_wait_for_reply(req);
                names = fxp_readdir_recv(pktin, req);

                if (names == NULL) {
                    if (fxp_error_type() == SSH_FX_EOF)
                        break;
                    with_stripctrl(san, fname)
                        printf("%s: reading directory: %s\n",
                               san, fxp_error());

                    req = fxp_close_send(dirhandle);
                    pktin = sftp_wait_for_reply(req);
                    fxp_close_recv(pktin, req);

                    sfree(ournames);
                    return false;
                }
                if (names->nnames == 0) {
                    fxp_free_names(names);
                    break;
                }
                sgrowarrayn(ournames, namesize, nnames, names->nnames);
                for (i = 0; i < names->nnames; i++)
                    if (strcmp(names->names[i].filename, ".") &&
                        strcmp(names->names[i].filename, "..")) {
                        if (!vet_filename(names->names[i].filename)) {
                            with_stripctrl(san, names->names[i].filename)
                                printf("ignoring potentially dangerous server-"
                                       "supplied filename '%s'\n", san);
                        } else {
                            ournames[nnames++] =
                                fxp_dup_name(&names->names[i]);
                        }
                    }
                fxp_free_names(names);
            }
            req = fxp_close_send(dirhandle);
            pktin = sftp_wait_for_reply(req);
            fxp_close_recv(pktin, req);

            /*
             * Sort the names into a clear order. This ought to
             * make things more predictable when we're doing a
             * reget of the same directory, just in case two
             * readdirs on the same remote directory return a
             * different order.
             */
            if (nnames > 0)
                qsort(ournames, nnames, sizeof(*ournames), sftp_name_compare);

            /*
             * If we're in restart mode, find the last filename on
             * this list that already exists. We may have to do a
             * reget on _that_ file, but shouldn't have to do
             * anything on the previous files.
             *
             * If none of them exists, of course, we start at 0.
             */
            i = 0;
            if (restart) {
                while (i < nnames) {
                    char *nextoutfname;
                    bool nonexistent;
                    nextoutfname = dir_file_cat(outfname,
                                                ournames[i]->filename);
                    nonexistent = (file_type(nextoutfname) ==
                                   FILE_TYPE_NONEXISTENT);
                    sfree(nextoutfname);
                    if (nonexistent)
                        break;
                    i++;
                }
                if (i > 0)
                    i--;
            }

            /*
             * Now we're ready to recurse. Starting at ournames[i]
             * and continuing on to the end of the list, we
             * construct a new source and target file name, and
             * call sftp_get_file again.
             */
            for (; i < nnames; i++) {
                char *nextfname, *nextoutfname;
                bool retd;

                nextfname = dupcat(fname, "/", ournames[i]->filename);
                nextoutfname = dir_file_cat(outfname, ournames[i]->filename);
                retd = sftp_get_file(
                    nextfname, nextoutfname, recurse, restart);
                restart = false;       /* after first partial file, do full */
                sfree(nextoutfname);
                sfree(nextfname);
                if (!retd) {
                    for (i = 0; i < nnames; i++) {
                        fxp_free_name(ournames[i]);
                    }
                    sfree(ournames);
                    return false;
                }
            }

            /*
             * Done this recursion level. Free everything.
             */
            for (i = 0; i < nnames; i++) {
                fxp_free_name(ournames[i]);
            }
            sfree(ournames);

            return true;
        }
    }

    req = fxp_stat_send(fname);
    pktin = sftp_wait_for_reply(req);
    if (!fxp_stat_recv(pktin, req, &attrs))
        attrs.flags = 0;

    req = fxp_open_send(fname, SSH_FXF_READ, NULL);
    pktin = sftp_wait_for_reply(req);
    fh = fxp_open_recv(pktin, req);

    if (!fh) {
        with_stripctrl(san, fname)
            printf("%s: open for read: %s\n", san, fxp_error());
        return false;
    }

    if (restart) {
        file = open_existing_wfile(outfname, NULL);
    } else {
        file = open_new_file(outfname, GET_PERMISSIONS(attrs, -1));
    }

    if (!file) {
        with_stripctrl(san, outfname)
            printf("local: unable to open %s\n", san);

        req = fxp_close_send(fh);
        pktin = sftp_wait_for_reply(req);
        fxp_close_recv(pktin, req);

        return false;
    }

    if (restart) {
        if (seek_file(file, 0, FROM_END) == -1) {
            close_wfile(file);
            with_stripctrl(san, outfname)
                printf("reget: cannot restart %s - file too large\n", san);
            req = fxp_close_send(fh);
            pktin = sftp_wait_for_reply(req);
            fxp_close_recv(pktin, req);

            return false;
        }

        offset = get_file_posn(file);
        printf("reget: restarting at file position %"PRIu64"\n", offset);
    } else {
        offset = 0;
    }

    with_stripctrl(san, fname) {
        with_stripctrl(sano, outfname)
            printf("remote:%s => local:%s\n", san, sano);
    }

    /*
     * FIXME: we can use FXP_FSTAT here to get the file size, and
     * thus put up a progress bar.
     */
    toret = true;
    xfer = xfer_download_init(fh, offset);
    while (!xfer_done(xfer)) {
        void *vbuf;
        int retd, len;
        int wpos, wlen;

        xfer_download_queue(xfer);
        pktin = sftp_recv();
        retd = xfer_download_gotpkt(xfer, pktin);
        if (retd <= 0) {
            if (!shown_err) {
                printf("error while reading: %s\n", fxp_error());
                shown_err = true;
            }
            if (retd == INT_MIN)        /* pktin not even freed */
                sfree(pktin);
            toret = false;
        }

        while (xfer_download_data(xfer, &vbuf, &len)) {
            unsigned char *buf = (unsigned char *)vbuf;

            wpos = 0;
            while (wpos < len) {
                wlen = write_to_file(file, buf + wpos, len - wpos);
                if (wlen <= 0) {
                    printf("error while writing local file\n");
                    toret = false;
                    xfer_set_error(xfer);
                    break;
                }
                wpos += wlen;
            }
            if (wpos < len) {          /* we had an error */
                toret = false;
                xfer_set_error(xfer);
            }

            sfree(vbuf);
        }
    }

    xfer_cleanup(xfer);

    close_wfile(file);

    req = fxp_close_send(fh);
    pktin = sftp_wait_for_reply(req);
    fxp_close_recv(pktin, req);

    return toret;
}